

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertpng.c
# Opt level: O3

opj_image_t * pngtoimage(char *read_idf,opj_cparameters_t *params)

{
  undefined8 uVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  convert_32s_CXPX p_Var5;
  opj_image_comp_t *poVar6;
  png_uint_32 pVar7;
  convert_XXx32s_C1R p_Var8;
  opj_cparameters_t *poVar9;
  byte bVar10;
  int iVar11;
  FILE *__stream;
  size_t sVar12;
  png_structp ppVar13;
  png_infop ppVar14;
  __jmp_buf_tag *__env;
  void *__ptr;
  void *pvVar15;
  ulong uVar16;
  opj_image_t *poVar17;
  OPJ_INT32 *__ptr_00;
  OPJ_INT32 **ppOVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  char *__format;
  long lVar22;
  png_uint_32 height;
  png_uint_32 width;
  int color_type;
  int bit_depth;
  png_uint_32 local_148;
  undefined4 local_144;
  double gamma;
  png_infop info;
  png_structp png;
  opj_image_t *local_128;
  FILE *local_120;
  convert_XXx32s_C1R local_118;
  convert_32s_CXPX local_110;
  opj_cparameters_t *local_108;
  int filter_type;
  int compression_type;
  int interlace_type;
  OPJ_BYTE sigbuf [8];
  OPJ_INT32 *planes [4];
  opj_image_cmptparm_t cmptparm [4];
  
  png = (png_structp)0x0;
  info = (png_infop)0x0;
  height = 0;
  __stream = fopen(read_idf,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"pngtoimage: can not open %s\n",read_idf);
    return (opj_image_t *)0x0;
  }
  sVar12 = fread(sigbuf,1,8,__stream);
  if ((sVar12 != 8) || (sigbuf != (OPJ_BYTE  [8])0xa1a0a0d474e5089)) {
    fprintf(_stderr,"pngtoimage: %s is no valid PNG file\n",read_idf);
    poVar17 = (opj_image_t *)0x0;
    goto LAB_001129e8;
  }
  poVar17 = (opj_image_t *)0x0;
  ppVar13 = (png_structp)png_create_read_struct("1.6.37",0,0,0);
  png = ppVar13;
  if (ppVar13 == (png_structp)0x0) goto LAB_001129e8;
  ppVar14 = (png_infop)png_create_info_struct(ppVar13);
  info = ppVar14;
  if (ppVar14 == (png_infop)0x0) {
LAB_001129d0:
    poVar17 = (opj_image_t *)0x0;
  }
  else {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar13,longjmp,200);
    iVar11 = _setjmp(__env);
    if (iVar11 != 0) goto LAB_001129d0;
    png_init_io(ppVar13,__stream);
    png_set_sig_bytes(ppVar13,8);
    png_read_info(ppVar13,ppVar14);
    iVar11 = png_get_IHDR(ppVar13,ppVar14,&width,&height,&bit_depth,&color_type,&interlace_type,
                          &compression_type,&filter_type);
    if (iVar11 == 0) goto LAB_001129d0;
    if (color_type == 3) {
      png_set_expand(ppVar13);
    }
    iVar11 = png_get_valid(ppVar13,ppVar14,0x10);
    if (iVar11 != 0) {
      png_set_expand(ppVar13);
    }
    iVar11 = png_get_gAMA(ppVar13,ppVar14,&gamma);
    if (iVar11 == 0) {
      gamma = 1.0;
    }
    png_set_gamma(0x3ff0000000000000,gamma,ppVar13);
    png_read_update_info(ppVar13,ppVar14);
    bVar10 = png_get_color_type(ppVar13,ppVar14);
    color_type = (int)bVar10;
    if ((bVar10 < 7) && ((0x55U >> (color_type & 0x1fU) & 1) != 0)) {
      local_144 = *(undefined4 *)(&DAT_00117a00 + (ulong)bVar10 * 4);
      uVar2 = *(uint *)(&DAT_00117a1c + (ulong)bVar10 * 4);
      uVar20 = (ulong)uVar2;
      p_Var5 = convert_32s_CXPX_LUT[uVar20];
      bVar10 = png_get_bit_depth(ppVar13,ppVar14);
      pVar7 = height;
      bit_depth = (int)bVar10;
      if (0x10 < bVar10) {
LAB_00112e9d:
        __format = "pngtoimage: bit depth %d is not supported\n";
        goto LAB_00112e28;
      }
      local_108 = params;
      if ((0x116U >> (bit_depth & 0x1fU) & 1) == 0) {
        if (bVar10 != 0x10) goto LAB_00112e9d;
        local_118 = convert_16u32s_C1R;
      }
      else {
        local_118 = convert_XXu32s_C1R_LUT[(uint)bVar10];
      }
      __ptr = calloc((ulong)(height + 1),8);
      if (__ptr == (void *)0x0) {
        pngtoimage_cold_2();
        goto LAB_001129d0;
      }
      local_110 = p_Var5;
      if (pVar7 != 0) {
        uVar16 = 0;
        do {
          sVar12 = png_get_rowbytes(ppVar13,ppVar14);
          pvVar15 = malloc(sVar12);
          *(void **)((long)__ptr + uVar16 * 8) = pvVar15;
          if (pvVar15 == (void *)0x0) {
            pngtoimage_cold_1();
            goto LAB_00112e48;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < height);
      }
      png_read_image(ppVar13,__ptr);
      memset(cmptparm,0,0x90);
      poVar9 = local_108;
      uVar1 = *(undefined8 *)&local_108->subsampling_dx;
      lVar22 = 0;
      do {
        *(int *)((long)&cmptparm[0].prec + lVar22) = bit_depth;
        *(int *)((long)&cmptparm[0].bpp + lVar22) = bit_depth;
        *(undefined4 *)((long)&cmptparm[0].sgnd + lVar22) = 0;
        *(undefined8 *)((long)&cmptparm[0].dx + lVar22) = uVar1;
        *(png_uint_32 *)((long)&cmptparm[0].w + lVar22) = width;
        *(png_uint_32 *)((long)&cmptparm[0].h + lVar22) = height;
        lVar22 = lVar22 + 0x24;
      } while (uVar20 * 0x24 != lVar22);
      poVar17 = (opj_image_t *)opj_image_create(uVar2,cmptparm,local_144);
      pVar7 = height;
      if (poVar17 == (opj_image_t *)0x0) {
LAB_00112e48:
        __ptr_00 = (OPJ_INT32 *)0x0;
        poVar17 = (opj_image_t *)0x0;
LAB_00112e50:
        uVar16 = (ulong)height;
      }
      else {
        OVar3 = poVar9->image_offset_x0;
        poVar17->x0 = OVar3;
        OVar4 = poVar9->image_offset_y0;
        poVar17->y0 = OVar4;
        local_148 = width;
        poVar17->x1 = (width - 1) * poVar9->subsampling_dx + OVar3 * 2 + 1;
        poVar17->y1 = (height - 1) * poVar9->subsampling_dy + OVar4 * 2 + 1;
        __ptr_00 = (OPJ_INT32 *)malloc(width * uVar20 * 4);
        p_Var5 = local_110;
        p_Var8 = local_118;
        if (__ptr_00 == (OPJ_INT32 *)0x0) {
          __ptr_00 = (OPJ_INT32 *)0x0;
          goto LAB_00112e50;
        }
        poVar6 = poVar17->comps;
        poVar6[uVar20 - 1].alpha = ~(ushort)uVar2 & 1;
        ppOVar18 = &poVar6->data;
        uVar16 = 0;
        do {
          planes[uVar16] = *ppOVar18;
          uVar16 = uVar16 + 1;
          ppOVar18 = ppOVar18 + 8;
        } while (uVar20 != uVar16);
        if (pVar7 == 0) goto LAB_00112e50;
        uVar21 = 0;
        uVar19 = (ulong)local_148;
        local_128 = poVar17;
        local_120 = __stream;
        do {
          (*p_Var8)(*(OPJ_BYTE **)((long)__ptr + uVar21 * 8),__ptr_00,uVar19 * uVar20);
          (*p_Var5)(__ptr_00,planes,(OPJ_SIZE_T)width);
          uVar19 = (ulong)width;
          planes[0] = planes[0] + uVar19;
          planes[1] = planes[1] + uVar19;
          planes[2] = planes[2] + uVar19;
          planes[3] = planes[3] + uVar19;
          uVar21 = uVar21 + 1;
          uVar16 = (ulong)height;
          __stream = local_120;
          poVar17 = local_128;
        } while (uVar21 < uVar16);
      }
      if ((int)uVar16 != 0) {
        uVar20 = 0;
        do {
          pvVar15 = *(void **)((long)__ptr + uVar20 * 8);
          if (pvVar15 != (void *)0x0) {
            free(pvVar15);
            uVar16 = (ulong)height;
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 < uVar16);
      }
      free(__ptr);
      if (__ptr_00 != (OPJ_INT32 *)0x0) {
        free(__ptr_00);
      }
    }
    else {
      __format = "pngtoimage: colortype %d is not supported\n";
LAB_00112e28:
      fprintf(_stderr,__format);
      poVar17 = (opj_image_t *)0x0;
    }
  }
  png_destroy_read_struct(&png,&info,0);
LAB_001129e8:
  fclose(__stream);
  return poVar17;
}

Assistant:

opj_image_t *pngtoimage(const char *read_idf, opj_cparameters_t * params)
{
	png_structp  png = NULL;
	png_infop    info = NULL;
	double gamma;
	int bit_depth, interlace_type,compression_type, filter_type;
	OPJ_UINT32 i;
	png_uint_32  width, height = 0U;
	int color_type;
	FILE *reader = NULL;
	OPJ_BYTE** rows = NULL;
	OPJ_INT32* row32s = NULL;
	/* j2k: */
	opj_image_t *image = NULL;
	opj_image_cmptparm_t cmptparm[4];
	OPJ_UINT32 nr_comp;
	OPJ_BYTE sigbuf[8];
	convert_XXx32s_C1R cvtXXTo32s = NULL;
	convert_32s_CXPX cvtCxToPx = NULL;
	OPJ_INT32* planes[4];
	
	if((reader = fopen(read_idf, "rb")) == NULL)
	{
		fprintf(stderr,"pngtoimage: can not open %s\n",read_idf);
		return NULL;
	}
	
	if(fread(sigbuf, 1, MAGIC_SIZE, reader) != MAGIC_SIZE
		 || memcmp(sigbuf, PNG_MAGIC, MAGIC_SIZE) != 0)
	{
		fprintf(stderr,"pngtoimage: %s is no valid PNG file\n",read_idf);
		goto fin;
	}
	
	if((png = png_create_read_struct(PNG_LIBPNG_VER_STRING,
																	 NULL, NULL, NULL)) == NULL)
		goto fin;
	if((info = png_create_info_struct(png)) == NULL)
		goto fin;
	
	if(setjmp(png_jmpbuf(png)))
		goto fin;
	
	png_init_io(png, reader);
	png_set_sig_bytes(png, MAGIC_SIZE);
	
	png_read_info(png, info);
	
	if(png_get_IHDR(png, info, &width, &height,
									&bit_depth, &color_type, &interlace_type,
									&compression_type, &filter_type) == 0)
		goto fin;
	
	/* png_set_expand():
	 * expand paletted images to RGB, expand grayscale images of
	 * less than 8-bit depth to 8-bit depth, and expand tRNS chunks
	 * to alpha channels.
	 */
	if(color_type == PNG_COLOR_TYPE_PALETTE) {
		png_set_expand(png);
	}
	
	if(png_get_valid(png, info, PNG_INFO_tRNS)) {
		png_set_expand(png);
	}
	/* We might wan't to expand background */
	/*
	if(png_get_valid(png, info, PNG_INFO_bKGD)) {
		png_color_16p bgnd;
		png_get_bKGD(png, info, &bgnd);
		png_set_background(png, bgnd, PNG_BACKGROUND_GAMMA_FILE, 1, 1.0);
	}
	*/
	
	if( !png_get_gAMA(png, info, &gamma))
		gamma = 1.0;
	
	/* we're not displaying but converting, screen gamma == 1.0 */
	png_set_gamma(png, 1.0, gamma);
	
	png_read_update_info(png, info);
	
	color_type = png_get_color_type(png, info);
	
	switch (color_type) {
		case PNG_COLOR_TYPE_GRAY:
			nr_comp = 1;
			break;
		case PNG_COLOR_TYPE_GRAY_ALPHA:
			nr_comp = 2;
			break;
		case PNG_COLOR_TYPE_RGB:
			nr_comp = 3;
			break;
		case PNG_COLOR_TYPE_RGB_ALPHA:
			nr_comp = 4;
			break;
		default:
			fprintf(stderr,"pngtoimage: colortype %d is not supported\n", color_type);
			goto fin;
	}
	cvtCxToPx = convert_32s_CXPX_LUT[nr_comp];
	bit_depth = png_get_bit_depth(png, info);
	
	switch (bit_depth) {
		case 1:
		case 2:
		case 4:
		case 8:
			cvtXXTo32s = convert_XXu32s_C1R_LUT[bit_depth];
			break;
		case 16: /* 16 bpp is specific to PNG */
			cvtXXTo32s = convert_16u32s_C1R;
			break;
		default:
			fprintf(stderr,"pngtoimage: bit depth %d is not supported\n", bit_depth);
			goto fin;
	}

	
	rows = (OPJ_BYTE**)calloc(height+1, sizeof(OPJ_BYTE*));
	if(rows == NULL){
		fprintf(stderr, "pngtoimage: memory out\n");
		goto fin;
	}
	for(i = 0; i < height; ++i){
		rows[i] = (OPJ_BYTE*)malloc(png_get_rowbytes(png,info));
		if(rows[i] == NULL){
			fprintf(stderr,"pngtoimage: memory out\n");
			goto fin;
		}
	}	
	png_read_image(png, rows);
	
	/* Create image */
	memset(cmptparm, 0, sizeof(cmptparm));
	for(i = 0; i < nr_comp; ++i)
	{
		cmptparm[i].prec = (OPJ_UINT32)bit_depth;
		/* bits_per_pixel: 8 or 16 */
		cmptparm[i].bpp = (OPJ_UINT32)bit_depth;
		cmptparm[i].sgnd = 0;
		cmptparm[i].dx = (OPJ_UINT32)params->subsampling_dx;
		cmptparm[i].dy = (OPJ_UINT32)params->subsampling_dy;
		cmptparm[i].w = (OPJ_UINT32)width;
		cmptparm[i].h = (OPJ_UINT32)height;
	}
	
	image = opj_image_create(nr_comp, &cmptparm[0], (nr_comp > 2U) ? OPJ_CLRSPC_SRGB : OPJ_CLRSPC_GRAY);
	if(image == NULL) goto fin;
	image->x0 = (OPJ_UINT32)params->image_offset_x0;
	image->y0 = (OPJ_UINT32)params->image_offset_y0;
	image->x1 = (OPJ_UINT32)(image->x0 + (width  - 1) * (OPJ_UINT32)params->subsampling_dx + 1 + image->x0);
	image->y1 = (OPJ_UINT32)(image->y0 + (height - 1) * (OPJ_UINT32)params->subsampling_dy + 1 + image->y0);
	
	row32s = (OPJ_INT32 *)malloc((size_t)width * nr_comp * sizeof(OPJ_INT32));
	if(row32s == NULL) goto fin;
	
	/* Set alpha channel */
	image->comps[nr_comp-1U].alpha = 1U - (nr_comp & 1U);
	
	for(i = 0; i < nr_comp; i++)
	{
		planes[i] = image->comps[i].data;
	}
	
	for(i = 0; i < height; ++i)
	{
		cvtXXTo32s(rows[i], row32s, (OPJ_SIZE_T)width * nr_comp);
		cvtCxToPx(row32s, planes, width);
		planes[0] += width;
		planes[1] += width;
		planes[2] += width;
		planes[3] += width;
	}
fin:
	if(rows)
	{
		for(i = 0; i < height; ++i)
			if(rows[i]) free(rows[i]);
		free(rows);
	}
	if (row32s) {
		free(row32s);
	}
	if(png)
		png_destroy_read_struct(&png, &info, NULL);
	
	fclose(reader);
	
	return image;
	
}